

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_cpplint.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (1 < argc) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      __s1 = argv[uVar3];
      iVar1 = strcmp(__s1,"--error");
      if (iVar1 == 0) {
        uVar2 = 1;
      }
      if (*__s1 != '-') {
        if (uVar2 != 0) {
          fprintf(_stderr,"%s:0:  message  [category/category] [0]\n",__s1);
        }
        fprintf(_stdout,"Done processing %s\nTotal errors found: %i\n",argv[uVar3],(ulong)uVar2);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  return uVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  int error = 0;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "--error") == 0) {
      error = 1;
    }
    if (argv[i][0] != '-') {
      if (error) {
        fprintf(stderr, "%s:0:  message  [category/category] [0]\n", argv[i]);
      }
      fprintf(stdout, "Done processing %s\nTotal errors found: %i\n", argv[i],
              error);
    }
  }
  return error;
}